

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O2

void __thiscall minibag::BZ2Stream::stopWrite(BZ2Stream *this)

{
  BagException *this_00;
  BagIOException *this_01;
  allocator<char> local_41;
  uint nbytes_out;
  uint nbytes_in;
  string local_38;
  
  if (this->bzfile_ == (BZFILE *)0x0) {
    this_00 = (BagException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"cannot close unopened bzfile",(allocator<char> *)&nbytes_in);
    BagException::BagException(this_00,&local_38);
    __cxa_throw(this_00,&BagException::typeinfo,std::runtime_error::~runtime_error);
  }
  BZ2_bzWriteClose(&this->bzerror_,this->bzfile_,0,&nbytes_in,&nbytes_out);
  if (this->bzerror_ != -6) {
    Stream::advanceOffset(&this->super_Stream,(ulong)nbytes_out);
    Stream::setCompressedIn(&this->super_Stream,0);
    return;
  }
  this_01 = (BagIOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"BZ_IO_ERROR",&local_41);
  BagIOException::BagIOException(this_01,&local_38);
  __cxa_throw(this_01,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BZ2Stream::stopWrite() {
    if (!bzfile_) {
        throw BagException("cannot close unopened bzfile");
    }

    unsigned int nbytes_in;
    unsigned int nbytes_out;
    BZ2_bzWriteClose(&bzerror_, bzfile_, 0, &nbytes_in, &nbytes_out);

    switch (bzerror_) {
        case BZ_IO_ERROR: throw BagIOException("BZ_IO_ERROR");
    }

    advanceOffset(nbytes_out);
    setCompressedIn(0);
}